

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int parse_miniscript(char *miniscript,char **key_name_array,char **key_value_array,size_t array_len,
                    uint32_t flags,uint32_t target,uint32_t *network,uint32_t descriptor_depth,
                    uint32_t descriptor_index,wally_descriptor_script_item *script_item,
                    size_t item_len,uint32_t *properties,char **script_ignore_checksum)

{
  uint32_t derive_child_num;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  uint32_t uVar4;
  size_t sVar5;
  uchar *puVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  char cVar10;
  miniscript_node_t *node;
  wally_descriptor_script_item *pwVar11;
  size_t sVar12;
  uchar *local_60;
  miniscript_node_t *local_58;
  size_t local_50;
  uchar *local_48;
  size_t local_40;
  size_t local_38;
  
  local_58 = (miniscript_node_t *)0x0;
  if (miniscript == (char *)0x0 || 1 < flags) {
    return -2;
  }
  if (array_len == 0) {
    if (key_name_array != (char **)0x0 || key_value_array != (char **)0x0) {
      return -2;
    }
  }
  else if (key_name_array == (char **)0x0 || key_value_array == (char **)0x0) {
    return -2;
  }
  cVar10 = *miniscript;
  if (cVar10 != '\0') {
    uVar9 = 0;
    do {
      if (1000000 < uVar9) {
        return -2;
      }
      if ((byte)(cVar10 + 0x81U) < 0xa1) {
        return -2;
      }
      cVar10 = miniscript[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (cVar10 != '\0');
  }
  if (array_len != 0) {
    sVar5 = 0;
    do {
      pcVar1 = key_name_array[sVar5];
      if (pcVar1 == (char *)0x0) {
        return -2;
      }
      pcVar2 = key_value_array[sVar5];
      if (pcVar2 == (char *)0x0) {
        return -2;
      }
      cVar10 = *pcVar1;
      if (cVar10 != '\0') {
        uVar9 = 0;
        do {
          if (0x10 < uVar9) {
            return -2;
          }
          if ((byte)(cVar10 + 0x81U) < 0xa1) {
            return -2;
          }
          cVar10 = pcVar1[uVar9 + 1];
          uVar9 = uVar9 + 1;
        } while (cVar10 != '\0');
      }
      cVar10 = *pcVar2;
      if (cVar10 != '\0') {
        uVar9 = 0;
        do {
          if (0x82 < uVar9) {
            return -2;
          }
          if ((byte)(cVar10 + 0x81U) < 0xa1) {
            return -2;
          }
          cVar10 = pcVar2[uVar9 + 1];
          uVar9 = uVar9 + 1;
        } while (cVar10 != '\0');
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != array_len);
  }
  iVar3 = analyze_miniscript(miniscript,key_name_array,key_value_array,array_len,target,network,
                             flags,(miniscript_node_t *)0x0,(miniscript_node_t *)0x0,&local_58,
                             (char **)properties);
  if (((iVar3 == 0) && (iVar3 = 0, (target & 2) != 0)) &&
     ((local_58->info == (miniscript_item_t *)0x0 || ((local_58->info->kind & 2) == 0)))) {
    iVar3 = -2;
  }
  local_60 = (uchar *)0x0;
  if (script_item != (wally_descriptor_script_item *)0x0 && iVar3 == 0) {
    if (item_len != 0) {
      sVar5 = 0;
      local_60 = (uchar *)0x0;
      sVar12 = 0;
LAB_004ad7cf:
      sVar7 = sVar5;
      if (script_item[sVar12].script == (uchar *)0x0) {
        sVar8 = sVar5;
        puVar6 = local_60;
        if (local_60 == (uchar *)0x0) {
          local_60 = (uchar *)wally_malloc(1000000);
          sVar7 = 1000000;
          sVar8 = 1000000;
          puVar6 = local_60;
          if (local_60 == (uchar *)0x0) {
            iVar3 = -3;
            local_60 = (uchar *)0x0;
            goto LAB_004ad972;
          }
        }
      }
      else {
        sVar8 = script_item[sVar12].script_len;
        puVar6 = script_item[sVar12].script;
      }
      pwVar11 = script_item + sVar12;
      derive_child_num = pwVar11->child_num;
      local_40 = 0;
      node = local_58;
      uVar4 = descriptor_depth;
      local_48 = puVar6;
      if (descriptor_depth != 0) {
        do {
          node = node->child;
          if (node == (miniscript_node_t *)0x0) goto LAB_004ad8ec;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      uVar4 = descriptor_index;
      if (descriptor_index != 0) {
        do {
          node = node->next;
          if (node == (miniscript_node_t *)0x0) goto LAB_004ad8ec;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      local_50 = sVar7;
      local_38 = sVar8;
      puVar6 = (uchar *)wally_malloc(1000000);
      if (puVar6 == (uchar *)0x0) {
        iVar3 = -3;
        sVar8 = 0;
        sVar5 = local_50;
      }
      else {
        iVar3 = generate_script_from_miniscript
                          (node,(miniscript_node_t *)0x0,derive_child_num,puVar6,1000000,&local_40);
        sVar8 = 0;
        if ((iVar3 == 0) && (sVar8 = local_40, local_40 <= local_38)) {
          memcpy(local_48,puVar6,local_40);
        }
        wally_bzero(puVar6,1000000);
        wally_free(puVar6);
        sVar5 = local_50;
      }
      goto LAB_004ad90b;
    }
    iVar3 = 0;
  }
  sVar5 = 0;
LAB_004ad972:
  if ((properties != (uint32_t *)0x0) && (iVar3 != 0)) {
    wally_free_string(*(char **)properties);
  }
  if (local_60 != (uchar *)0x0) {
    wally_bzero(local_60,sVar5);
    wally_free(local_60);
  }
  free_miniscript_node(local_58);
  return iVar3;
LAB_004ad8ec:
  iVar3 = -2;
  sVar8 = 0;
  sVar5 = sVar7;
LAB_004ad90b:
  if (iVar3 != 0) goto LAB_004ad972;
  if (pwVar11->script == (uchar *)0x0) {
    puVar6 = (uchar *)wally_malloc(sVar8);
    pwVar11->script = puVar6;
    if (puVar6 == (uchar *)0x0) {
      iVar3 = -3;
      goto LAB_004ad972;
    }
    memcpy(puVar6,local_48,sVar8);
  }
  pwVar11->script_len = sVar8;
  sVar12 = sVar12 + 1;
  if (sVar12 == item_len) goto code_r0x004ad959;
  goto LAB_004ad7cf;
code_r0x004ad959:
  iVar3 = 0;
  goto LAB_004ad972;
}

Assistant:

static int parse_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t flags,
    uint32_t target,
    uint32_t *network,
    uint32_t descriptor_depth,
    uint32_t descriptor_index,
    struct wally_descriptor_script_item *script_item,
    size_t item_len,
    uint32_t *properties,
    char **script_ignore_checksum)
{
    int ret;
    size_t index;
    unsigned char *work_script = NULL;
    size_t work_script_len = 0;
    unsigned char *temp_script = NULL;
    size_t temp_script_len = 0;
    size_t write_len;
    struct miniscript_node_t *top_node = NULL;
    bool is_tapscript = false;

    if (((flags & ~0x1) != 0) ||
        !miniscript || (array_len && (!key_name_array || !key_value_array)) ||
        (!array_len && (key_name_array || key_value_array)) ||
        check_ascii_string(miniscript, DESCRIPTOR_LIMIT_LENGTH))
        return WALLY_EINVAL;

    if (array_len) {
        for (index = 0; index < array_len; ++index) {
            if (!key_name_array[index] || !key_value_array[index])
                return WALLY_EINVAL;
            if (check_ascii_string(key_name_array[index], DESCRIPTOR_KEY_NAME_MAX_LENGTH) ||
                check_ascii_string(key_value_array[index], DESCRIPTOR_KEY_VALUE_MAX_LENGTH)) {
                return WALLY_EINVAL;
            }
        }
    }

    ret = analyze_miniscript(miniscript, key_name_array, key_value_array, array_len,
                             target, network, flags,
                             NULL, NULL, &top_node, script_ignore_checksum);
    if ((ret == WALLY_OK) && (target & DESCRIPTOR_KIND_DESCRIPTOR) &&
        (!top_node->info || !(top_node->info->kind & DESCRIPTOR_KIND_DESCRIPTOR)))
        ret = WALLY_EINVAL;
    if ((ret == WALLY_OK) && script_item) {
        for (index = 0; index < item_len; ++index) {
            write_len = 0;

            temp_script = script_item[index].script;
            temp_script_len = script_item[index].script_len;
            if (!temp_script) {
                if (!work_script) {
                    work_script = (unsigned char *)wally_malloc(DESCRIPTOR_LIMIT_LENGTH);
                    if (!work_script) {
                        ret = WALLY_ENOMEM;
                        break;
                    }
                    work_script_len = DESCRIPTOR_LIMIT_LENGTH;
                }
                temp_script = work_script;
                temp_script_len = work_script_len;
            }
            ret = convert_script_from_node(top_node, script_item[index].child_num,
                                           descriptor_depth, descriptor_index,
                                           temp_script, temp_script_len,
                                           &write_len);
            if (ret != WALLY_OK)
                break;
            if (!script_item[index].script) {
                script_item[index].script = (unsigned char *)wally_malloc(write_len);
                if (!script_item[index].script) {
                    ret = WALLY_ENOMEM;
                    break;
                }
                memcpy(script_item[index].script, temp_script, write_len);
            }
            script_item[index].script_len = write_len;
        }
    }
    if ((ret == WALLY_OK) && properties)
        *properties = top_node->type_properties;

    if ((ret != WALLY_OK) && script_ignore_checksum)
        wally_free_string(*script_ignore_checksum);
    if (work_script) {
        wally_bzero(work_script, work_script_len);
        wally_free(work_script);
    }
    free_miniscript_node(top_node);
    return ret;
}